

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O2

int convert_8srp(uchar *data,_sample *gus_sample)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  short *psVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar2 = gus_sample->loop_end;
  uVar3 = gus_sample->data_length;
  uVar16 = (ulong)uVar3;
  uVar4 = gus_sample->loop_start;
  uVar15 = (ulong)(uVar2 - uVar4);
  psVar7 = (short *)calloc(uVar15 * 2 + 2 + uVar16,2);
  gus_sample->data = psVar7;
  if (psVar7 == (short *)0x0) {
    piVar8 = __errno_location();
    _WM_ERROR("convert_8srp",0xcc,1,"to parse sample",*piVar8);
    iVar6 = -1;
  }
  else {
    lVar5 = uVar15 * 2;
    uVar11 = uVar15 * 4 ^ 0xfffffffffffffffc;
    lVar14 = -1;
    lVar9 = 0;
    do {
      psVar7[lVar9] = (ushort)data[lVar14 + uVar16] << 8;
      lVar9 = lVar9 + 1;
      uVar11 = uVar11 - 2;
      lVar14 = lVar14 + -1;
    } while (~(ulong)uVar2 + uVar16 != lVar9);
    pbVar12 = data + (uVar16 - lVar9) + -2;
    bVar1 = data[uVar2];
    psVar7[lVar9] = (ushort)bVar1 << 8;
    psVar7[lVar9 + uVar15 * 2] = (ushort)bVar1 << 8;
    lVar13 = lVar5 + lVar9 + 1;
    lVar14 = lVar5 + lVar9;
    do {
      lVar10 = lVar9;
      lVar14 = lVar14 + -1;
      bVar1 = *pbVar12;
      pbVar12 = pbVar12 + -1;
      psVar7[lVar10 + 1] = (ushort)bVar1 << 8;
      psVar7[lVar14] = (ushort)bVar1 << 8;
      psVar7[lVar13] = psVar7[lVar10 + 1];
      uVar11 = uVar11 - 2;
      lVar9 = lVar10 + 1;
      lVar13 = lVar13 + 1;
    } while ((uVar16 - uVar4) + -2 != lVar9);
    bVar1 = data[uVar4];
    psVar7[lVar10 + 2] = (ushort)bVar1 << 8;
    psVar7[lVar13] = (ushort)bVar1 << 8;
    psVar7 = (short *)((long)psVar7 - uVar11);
    lVar9 = -lVar9;
    do {
      *psVar7 = (ushort)data[lVar9 + (uVar16 - 3)] << 8;
      lVar9 = lVar9 + -1;
      psVar7 = psVar7 + 2;
    } while (2 - uVar16 != lVar9);
    gus_sample->loop_start = uVar2;
    gus_sample->loop_end = (int)lVar5 + uVar2;
    gus_sample->data_length = (uVar2 - uVar4) * 2 + uVar3;
    gus_sample->modes = gus_sample->modes ^ 0x18;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int convert_8srp(unsigned char *data, struct _sample *gus_sample) {
	unsigned long int loop_length = gus_sample->loop_end
			- gus_sample->loop_start;
	unsigned long int dloop_length = loop_length * 2;
	unsigned long int new_length = gus_sample->data_length + dloop_length;
	unsigned char *read_data = data + gus_sample->data_length - 1;
	unsigned char *read_end = data + gus_sample->loop_end;
	signed short int *write_data = NULL;
	signed short int *write_data_a = NULL;
	signed short int *write_data_b = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc((new_length + 2), sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data++ = (*read_data--) << 8;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		write_data_a = write_data + dloop_length;
		*write_data_a-- = *write_data;
		write_data++;
		write_data_b = write_data + dloop_length;
		read_end = data + gus_sample->loop_start;
		do {
			*write_data = (*read_data--) << 8;
			*write_data_a-- = *write_data;
			*write_data_b++ = *write_data;
			write_data++;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		*write_data_b++ = *write_data;
		read_end = data - 1;
		do {
			*write_data_b++ = (*read_data--) << 8;
			write_data_b++;
		} while (read_data != read_end);
		gus_sample->loop_start += loop_length;
		gus_sample->loop_end += dloop_length;
		gus_sample->data_length = new_length;
		gus_sample->modes ^= SAMPLE_PINGPONG | SAMPLE_REVERSE;
		return 0;
	}

	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}